

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::clear
          (Heap<Glucose::SimpSolver::ElimLt> *this,bool dealloc)

{
  int iVar1;
  int *piVar2;
  long in_RDI;
  int i;
  vec<int> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  undefined4 local_10;
  
  local_10 = 0;
  while( true ) {
    iVar3 = local_10;
    iVar1 = vec<int>::size((vec<int> *)(in_RDI + 8));
    if (iVar1 <= iVar3) break;
    in_stack_ffffffffffffffd8 = (vec<int> *)(in_RDI + 0x18);
    piVar2 = vec<int>::operator[]((vec<int> *)(in_RDI + 8),local_10);
    piVar2 = vec<int>::operator[](in_stack_ffffffffffffffd8,*piVar2);
    *piVar2 = -1;
    local_10 = local_10 + 1;
  }
  vec<int>::clear((vec<int> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                  SUB81((ulong)in_stack_ffffffffffffffd8 >> 0x38,0));
  return;
}

Assistant:

void clear(bool dealloc = false) 
    { 
        for (int i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dealloc); 
    }